

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpp_primitive_field.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::cpp::PrimitiveFieldGenerator::GenerateByteSize
          (PrimitiveFieldGenerator *this,Printer *printer)

{
  Type type;
  int iVar1;
  int fixed_size;
  Printer *printer_local;
  PrimitiveFieldGenerator *this_local;
  
  type = FieldDescriptor::type(this->descriptor_);
  iVar1 = anon_unknown_3::FixedSize(type);
  if (iVar1 == -1) {
    io::Printer::Print(printer,&this->variables_,
                       "total_size += $tag_size$ +\n  ::google::protobuf::internal::WireFormatLite::$declared_type$Size(\n    this->$name$());\n"
                      );
  }
  else {
    io::Printer::Print(printer,&this->variables_,"total_size += $tag_size$ + $fixed_size$;\n");
  }
  return;
}

Assistant:

void PrimitiveFieldGenerator::
GenerateByteSize(io::Printer* printer) const {
  int fixed_size = FixedSize(descriptor_->type());
  if (fixed_size == -1) {
    printer->Print(variables_,
      "total_size += $tag_size$ +\n"
      "  ::google::protobuf::internal::WireFormatLite::$declared_type$Size(\n"
      "    this->$name$());\n");
  } else {
    printer->Print(variables_,
      "total_size += $tag_size$ + $fixed_size$;\n");
  }
}